

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_soc.cpp
# Opt level: O2

MppDecHwCap * mpp_get_dec_hw_info_by_client_type(MppClientType client_type)

{
  MppDecHwCap *pMVar1;
  MppSocInfo *pMVar2;
  long lVar3;
  
  lVar3 = 2;
  pMVar2 = mpp_get_soc_info();
  while( true ) {
    if (lVar3 == 8) {
      return (MppDecHwCap *)0x0;
    }
    pMVar1 = pMVar2->dec_caps[lVar3 + -2];
    if ((pMVar1 != (MppDecHwCap *)0x0) && ((byte)pMVar1->field_0x4 == client_type)) break;
    lVar3 = lVar3 + 1;
  }
  return pMVar1;
}

Assistant:

const MppDecHwCap* mpp_get_dec_hw_info_by_client_type(MppClientType client_type)
{
    const MppDecHwCap* hw_info = NULL;
    const MppSocInfo *info = mpp_get_soc_info();
    RK_U32 i = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(info->dec_caps); i++) {
        if (info->dec_caps[i] && info->dec_caps[i]->type == client_type) {
            hw_info = info->dec_caps[i];
            break;
        }
    }

    return hw_info;
}